

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_18::NameGenerator::VisitExport(NameGenerator *this,Export *export_)

{
  Func *pFVar1;
  char *name_00;
  Tag *tag;
  Global *global;
  Memory *memory;
  Table *table;
  Func *func;
  Func *pFStack_30;
  Index index;
  string *name;
  BindingHash *bindings;
  Export *export__local;
  NameGenerator *this_local;
  
  name = (string *)0x0;
  pFStack_30 = (Func *)0x0;
  func._4_4_ = 0xffffffff;
  switch(export_->kind) {
  case First:
    pFVar1 = Module::GetFunc(this->module_,&export_->var);
    if (pFVar1 != (Func *)0x0) {
      func._4_4_ = Module::GetFuncIndex(this->module_,&export_->var);
      name = (string *)&this->module_->func_bindings;
      pFStack_30 = pFVar1;
    }
    break;
  case Table:
    pFVar1 = (Func *)Module::GetTable(this->module_,&export_->var);
    if (pFVar1 != (Func *)0x0) {
      func._4_4_ = Module::GetTableIndex(this->module_,&export_->var);
      name = (string *)&this->module_->table_bindings;
      pFStack_30 = pFVar1;
    }
    break;
  case Memory:
    pFVar1 = (Func *)Module::GetMemory(this->module_,&export_->var);
    if (pFVar1 != (Func *)0x0) {
      func._4_4_ = Module::GetMemoryIndex(this->module_,&export_->var);
      name = (string *)&this->module_->memory_bindings;
      pFStack_30 = pFVar1;
    }
    break;
  case Global:
    pFVar1 = (Func *)Module::GetGlobal(this->module_,&export_->var);
    if (pFVar1 != (Func *)0x0) {
      func._4_4_ = Module::GetGlobalIndex(this->module_,&export_->var);
      name = (string *)&this->module_->global_bindings;
      pFStack_30 = pFVar1;
    }
    break;
  case Last:
    pFVar1 = (Func *)Module::GetTag(this->module_,&export_->var);
    if (pFVar1 != (Func *)0x0) {
      func._4_4_ = Module::GetTagIndex(this->module_,&export_->var);
      name = (string *)&this->module_->tag_bindings;
      pFStack_30 = pFVar1;
    }
  }
  if ((name != (string *)0x0) && (pFStack_30 != (Func *)0x0)) {
    name_00 = (char *)std::__cxx11::string::c_str();
    MaybeUseAndBindName(this,(BindingHash *)name,name_00,func._4_4_,&pFStack_30->name);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::VisitExport(Export* export_) {
  BindingHash* bindings = nullptr;
  std::string* name = nullptr;
  Index index = kInvalidIndex;

  switch (export_->kind) {
    case ExternalKind::Func:
      if (Func* func = module_->GetFunc(export_->var)) {
        index = module_->GetFuncIndex(export_->var);
        bindings = &module_->func_bindings;
        name = &func->name;
      }
      break;

    case ExternalKind::Table:
      if (Table* table = module_->GetTable(export_->var)) {
        index = module_->GetTableIndex(export_->var);
        bindings = &module_->table_bindings;
        name = &table->name;
      }
      break;

    case ExternalKind::Memory:
      if (Memory* memory = module_->GetMemory(export_->var)) {
        index = module_->GetMemoryIndex(export_->var);
        bindings = &module_->memory_bindings;
        name = &memory->name;
      }
      break;

    case ExternalKind::Global:
      if (Global* global = module_->GetGlobal(export_->var)) {
        index = module_->GetGlobalIndex(export_->var);
        bindings = &module_->global_bindings;
        name = &global->name;
      }
      break;

    case ExternalKind::Tag:
      if (Tag* tag = module_->GetTag(export_->var)) {
        index = module_->GetTagIndex(export_->var);
        bindings = &module_->tag_bindings;
        name = &tag->name;
      }
      break;
  }

  if (bindings && name) {
    MaybeUseAndBindName(bindings, export_->name.c_str(), index, name);
  }

  return Result::Ok;
}